

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O2

void __thiscall isotropic::isotropic(isotropic *this,color *albedo)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  element_type *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  (this->super_material)._vptr_material = (_func_int **)&PTR__isotropic_00125d68;
  std::make_shared<solid_color,vec3_const&>((vec3 *)&local_18);
  _Var1._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->tex).super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_18;
  (this->tex).super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  local_18 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10);
  return;
}

Assistant:

isotropic(const color& albedo) : tex(make_shared<solid_color>(albedo)) {}